

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.cpp
# Opt level: O3

ContainerMetadata __thiscall
duckdb::roaring::ContainerMetadataCollectionScanner::GetNext
          (ContainerMetadataCollectionScanner *this)

{
  byte bVar1;
  size_type sVar2;
  ContainerMetadata CVar3;
  byte *pbVar4;
  
  sVar2 = this->idx;
  this->idx = sVar2 + 1;
  pbVar4 = vector<unsigned_char,_true>::operator[](&this->collection->container_type,sVar2);
  bVar1 = *pbVar4;
  if ((bVar1 & 2) == 0) {
    sVar2 = this->array_idx;
    this->array_idx = sVar2 + 1;
    pbVar4 = vector<unsigned_char,_true>::operator[](&this->collection->cardinality,sVar2);
    CVar3.container_type = BITSET_CONTAINER;
    CVar3.nulls = true;
    CVar3.count = 0xf9;
    if (*pbVar4 != 0xf9) {
      CVar3 = (ContainerMetadata)((uint)*pbVar4 * 0x10000 + (bVar1 & 1) * 0x100 + 1);
    }
  }
  else {
    sVar2 = this->run_idx;
    this->run_idx = sVar2 + 1;
    pbVar4 = vector<unsigned_char,_true>::operator[](&this->collection->number_of_runs,sVar2);
    CVar3 = (ContainerMetadata)((uint)*pbVar4 << 0x10 | 0x100);
  }
  return CVar3;
}

Assistant:

ContainerMetadata ContainerMetadataCollectionScanner::GetNext() {
	D_ASSERT(idx < collection.count_in_segment);
	auto type = collection.container_type[idx++];
	const bool is_inverted = (type & 1) == 1;
	const bool is_run = ((type >> 1) & 1) == 1;
	uint8_t amount;
	if (is_run) {
		amount = collection.number_of_runs[run_idx++];
	} else {
		amount = collection.cardinality[array_idx++];
	}
	if (is_run) {
		return ContainerMetadata::RunContainer(amount);
	}
	if (amount == BITSET_CONTAINER_SENTINEL_VALUE) {
		return ContainerMetadata::BitsetContainer(amount);
	}
	return ContainerMetadata::ArrayContainer(amount, is_inverted);
}